

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::split(Solver *this,LitVec *out)

{
  bool bVar1;
  Literal LVar2;
  Literal LVar3;
  undefined8 in_RSI;
  uint32 dl;
  Solver *in_RDI;
  Solver *unaff_retaddr;
  Literal *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  dl = (uint32)((ulong)in_RSI >> 0x20);
  bVar1 = splittable((Solver *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (bVar1) {
    copyGuidingPath(unaff_retaddr,
                    (LitVec *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    pushRootLevel((Solver *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (uint32)((ulong)in_RDI >> 0x20));
    rootLevel(in_RDI);
    LVar2 = decision(in_RDI,dl);
    LVar3 = Literal::operator~(in_stack_ffffffffffffffc8);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(LVar3.rep_,LVar2.rep_),(Literal *)in_RDI);
    in_RDI->splitReq_ = false;
    SolverStats::addSplit(&in_RDI->stats,1);
  }
  return bVar1;
}

Assistant:

bool Solver::split(LitVec& out) {
	if (!splittable()) { return false; }
	copyGuidingPath(out);
	pushRootLevel();
	out.push_back(~decision(rootLevel()));
	splitReq_ = false;
	stats.addSplit();
	return true;
}